

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsDiv.c
# Opt level: O1

void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *pObj,Vec_Ptr_t *vCone)

{
  int iVar1;
  Abc_Ntk_t *pAVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  void **ppvVar5;
  int in_EDX;
  int Fill;
  int iVar6;
  long lVar7;
  
  pAVar2 = pObj->pNtk;
  iVar6 = pObj->Id;
  Vec_IntFillExtra(&pAVar2->vTravIds,iVar6 + 1,in_EDX);
  if (((long)iVar6 < 0) || ((pAVar2->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
  }
  pAVar3 = pObj->pNtk;
  iVar1 = pAVar3->nTravIds;
  if ((pAVar2->vTravIds).pArray[iVar6] == iVar1) {
    return;
  }
  iVar6 = pObj->Id;
  Vec_IntFillExtra(&pAVar3->vTravIds,iVar6 + 1,Fill);
  if (((long)iVar6 < 0) || ((pAVar3->vTravIds).nSize <= iVar6)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                  ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
  }
  (pAVar3->vTravIds).pArray[iVar6] = iVar1;
  uVar4 = *(uint *)&pObj->field_0x14 & 0xf;
  if ((uVar4 != 2) && (uVar4 != 5)) {
    if (uVar4 != 7) {
      __assert_fail("Abc_ObjIsNode(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/mfs/mfsDiv.c"
                    ,0x39,"void Abc_MfsWinMarkTfi_rec(Abc_Obj_t *, Vec_Ptr_t *)");
    }
    if (0 < (pObj->vFanins).nSize) {
      lVar7 = 0;
      do {
        Abc_MfsWinMarkTfi_rec
                  ((Abc_Obj_t *)pObj->pNtk->vObjs->pArray[(pObj->vFanins).pArray[lVar7]],vCone);
        lVar7 = lVar7 + 1;
      } while (lVar7 < (pObj->vFanins).nSize);
    }
  }
  uVar4 = vCone->nCap;
  if (vCone->nSize == uVar4) {
    if ((int)uVar4 < 0x10) {
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,0x80);
      }
      vCone->pArray = ppvVar5;
      iVar6 = 0x10;
    }
    else {
      iVar6 = uVar4 * 2;
      if (iVar6 <= (int)uVar4) goto LAB_00445f25;
      if (vCone->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar4 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vCone->pArray,(ulong)uVar4 << 4);
      }
      vCone->pArray = ppvVar5;
    }
    vCone->nCap = iVar6;
  }
LAB_00445f25:
  iVar6 = vCone->nSize;
  vCone->nSize = iVar6 + 1;
  vCone->pArray[iVar6] = pObj;
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Marks and collects the TFI cone of the node.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Abc_MfsWinMarkTfi_rec( Abc_Obj_t * pObj, Vec_Ptr_t * vCone )
{
    Abc_Obj_t * pFanin;
    int i;
    if ( Abc_NodeIsTravIdCurrent(pObj) )
        return;
    Abc_NodeSetTravIdCurrent( pObj );
    if ( Abc_ObjIsCi(pObj) )
    {
        Vec_PtrPush( vCone, pObj );
        return;
    }
    assert( Abc_ObjIsNode(pObj) );
    // visit the fanins of the node
    Abc_ObjForEachFanin( pObj, pFanin, i )
        Abc_MfsWinMarkTfi_rec( pFanin, vCone );
    Vec_PtrPush( vCone, pObj );
}